

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O0

Var Js::WasmLibrary::WasmLazyTrapCallback(RecyclableObject *callee,CallInfo param_2,...)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext_00;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  JavascriptError *object;
  JavascriptError *error;
  ScriptContext *scriptContext;
  WasmScriptFunction *asmFunction;
  RecyclableObject *callee_local;
  CallInfo param_1_local;
  
  if (callee == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x11,"(asmFunction)","asmFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext_00 = RecyclableObject::GetScriptContext(callee);
  if (scriptContext_00 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x13,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)callee);
  this_00 = FunctionBody::GetAsmJsFunctionInfo(this);
  object = AsmJsFunctionInfo::GetLazyError(this_00);
  JavascriptExceptionOperators::Throw(object,scriptContext_00);
}

Assistant:

Var WasmLibrary::WasmLazyTrapCallback(RecyclableObject *callee, CallInfo, ...)
    {
        WasmScriptFunction* asmFunction = static_cast<WasmScriptFunction*>(callee);
        Assert(asmFunction);
        ScriptContext * scriptContext = asmFunction->GetScriptContext();
        Assert(scriptContext);
        auto error = asmFunction->GetFunctionBody()->GetAsmJsFunctionInfo()->GetLazyError();
        JavascriptExceptionOperators::Throw(error, scriptContext);
    }